

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_findFrameCompressedSize(void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  size_t code;
  size_t cBlockSize;
  int local_70;
  blockProperties_t blockProperties;
  size_t ret;
  ZSTD_frameHeader zfh;
  size_t remainingSize;
  BYTE *ipstart;
  BYTE *ip;
  size_t srcSize_local;
  void *src_local;
  
  if ((srcSize < 8) || (UVar1 = MEM_readLE32(src), (UVar1 & 0xfffffff0) != 0x184d2a50)) {
    zfh._32_8_ = srcSize;
    blockProperties._4_8_ = ZSTD_getFrameHeader((ZSTD_frameHeader *)&ret,src,srcSize);
    uVar2 = ERR_isError(blockProperties._4_8_);
    if (uVar2 == 0) {
      if (blockProperties._4_8_ == 0) {
        ipstart = (BYTE *)((long)src + (ulong)zfh.blockSizeMax);
        zfh._32_8_ = zfh._32_8_ - (ulong)zfh.blockSizeMax;
        do {
          code = ZSTD_getcBlockSize(ipstart,zfh._32_8_,(blockProperties_t *)((long)&cBlockSize + 4))
          ;
          uVar2 = ERR_isError(code);
          if (uVar2 != 0) {
            return code;
          }
          if ((ulong)zfh._32_8_ < code + 3) {
            return 0xffffffffffffffb8;
          }
          ipstart = ipstart + code + 3;
          zfh._32_8_ = zfh._32_8_ - (code + 3);
        } while (local_70 == 0);
        if (zfh.headerSize != 0) {
          if ((ulong)zfh._32_8_ < 4) {
            return 0xffffffffffffffb8;
          }
          ipstart = ipstart + 4;
        }
        src_local = ipstart + -(long)src;
      }
      else {
        src_local = (void *)0xffffffffffffffb8;
      }
    }
    else {
      src_local = (void *)blockProperties._4_8_;
    }
  }
  else {
    src_local = (void *)readSkippableFrameSize(src,srcSize);
  }
  return (size_t)src_local;
}

Assistant:

size_t ZSTD_findFrameCompressedSize(const void *src, size_t srcSize)
{
#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
#endif
    if ( (srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
      && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START ) {
        return readSkippableFrameSize(src, srcSize);
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret)) return ret;
            if (ret > 0) return ERROR(srcSize_wrong);
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Loop on each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ERROR(srcSize_wrong);

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;

            if (blockProperties.lastBlock) break;
        }

        if (zfh.checksumFlag) {   /* Final frame content checksum */
            if (remainingSize < 4) return ERROR(srcSize_wrong);
            ip += 4;
        }

        return ip - ipstart;
    }
}